

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amount_tests.cpp
# Opt level: O2

void amount_tests::ToStringTest_invoker(void)

{
  unit_test_log_t *puVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_wrap_stringstream<char> *this;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  pointer local_260;
  pointer local_258;
  char *local_250;
  char *local_248;
  pointer local_240;
  pointer local_238;
  char *local_230;
  char *local_228;
  pointer local_220;
  pointer local_218;
  char *local_210;
  char *local_208;
  pointer local_200;
  pointer local_1f8;
  char *local_1f0;
  char *local_1e8;
  pointer local_1e0;
  pointer local_1d8;
  char *local_1d0;
  char *local_1c8;
  basic_wrap_stringstream<char> local_1c0;
  long local_28;
  
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_1c8 = "";
  memset(&local_1c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_1c0);
  std::operator<<((ostream *)&local_1c0,'\"');
  std::operator<<((ostream *)&local_1c0,"ToStringTest");
  std::operator<<((ostream *)&local_1c0,"\" fixture ctor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_1c0);
  local_1e0 = (pbVar2->_M_dataplus)._M_p;
  local_1d8 = local_1e0 + pbVar2->_M_string_length;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x85;
  file.m_begin = (iterator)&local_1d0;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,file,(size_t)&local_1e0,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_1c0);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_1e8 = "";
  memset(&local_1c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_1c0);
  std::operator<<((ostream *)&local_1c0,'\"');
  std::operator<<((ostream *)&local_1c0,"ToStringTest");
  std::operator<<((ostream *)&local_1c0,"\" fixture setup");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_1c0);
  local_200 = (pbVar2->_M_dataplus)._M_p;
  local_1f8 = local_200 + pbVar2->_M_string_length;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  file_00.m_end = (iterator)0x85;
  file_00.m_begin = (iterator)&local_1f0;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,file_00,(size_t)&local_200,msg_00);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_1c0);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_208 = "";
  memset(&local_1c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_1c0);
  std::operator<<((ostream *)&local_1c0,'\"');
  std::operator<<((ostream *)&local_1c0,"ToStringTest");
  std::operator<<((ostream *)&local_1c0,"\" test entry");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_1c0);
  local_220 = (pbVar2->_M_dataplus)._M_p;
  local_218 = local_220 + pbVar2->_M_string_length;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  file_01.m_end = (iterator)0x85;
  file_01.m_begin = (iterator)&local_210;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,file_01,(size_t)&local_220,msg_01);
  this = &local_1c0;
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this);
  ToStringTest::test_method((ToStringTest *)this);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_228 = "";
  memset(&local_1c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_1c0);
  std::operator<<((ostream *)&local_1c0,'\"');
  std::operator<<((ostream *)&local_1c0,"ToStringTest");
  std::operator<<((ostream *)&local_1c0,"\" fixture teardown");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_1c0);
  local_240 = (pbVar2->_M_dataplus)._M_p;
  local_238 = local_240 + pbVar2->_M_string_length;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  file_02.m_end = (iterator)0x85;
  file_02.m_begin = (iterator)&local_230;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,file_02,(size_t)&local_240,msg_02);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_1c0);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_248 = "";
  memset(&local_1c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_1c0);
  std::operator<<((ostream *)&local_1c0,'\"');
  std::operator<<((ostream *)&local_1c0,"ToStringTest");
  std::operator<<((ostream *)&local_1c0,"\" fixture dtor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_1c0);
  local_260 = (pbVar2->_M_dataplus)._M_p;
  local_258 = local_260 + pbVar2->_M_string_length;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  file_03.m_end = (iterator)0x85;
  file_03.m_begin = (iterator)&local_250;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,file_03,(size_t)&local_260,msg_03);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_1c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ToStringTest)
{
    CFeeRate feeRate;
    feeRate = CFeeRate(1);
    BOOST_CHECK_EQUAL(feeRate.ToString(), "0.00000001 BTC/kvB");
    BOOST_CHECK_EQUAL(feeRate.ToString(FeeEstimateMode::BTC_KVB), "0.00000001 BTC/kvB");
    BOOST_CHECK_EQUAL(feeRate.ToString(FeeEstimateMode::SAT_VB), "0.001 sat/vB");
}